

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetBit
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  uint32 uVar1;
  LogMessage *other;
  uint32 *puVar2;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (*(char *)(*(long *)(field + 0x80) + 0x6f) == '\x01') {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x7eb);
    other = LogMessage::operator<<(&local_60,"CHECK failed: !field->options().weak(): ");
    LogFinisher::operator=(&local_61,other);
    LogMessage::~LogMessage(&local_60);
  }
  if ((this->schema_).has_bits_offset_ != -1) {
    uVar1 = ReflectionSchema::HasBitIndex(&this->schema_,field);
    puVar2 = MutableHasBits(this,message);
    puVar2[uVar1 >> 5] = puVar2[uVar1 >> 5] | 1 << ((byte)uVar1 & 0x1f);
  }
  return;
}

Assistant:

inline void GeneratedMessageReflection::SetBit(
    Message* message, const FieldDescriptor* field) const {
  GOOGLE_DCHECK(!field->options().weak());
  if (!schema_.HasHasbits()) {
    return;
  }
  const uint32 index = schema_.HasBitIndex(field);
  MutableHasBits(message)[index / 32] |=
      (static_cast<uint32>(1) << (index % 32));
}